

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.c
# Opt level: O0

rt_function_error_t allocate_deconvolution_local_context(rt_function_t *f)

{
  undefined8 *puVar1;
  long *plVar2;
  rt_variable_getter p_Var3;
  rt_variable_setter p_Var4;
  rt_list_t rVar5;
  int local_84;
  int i_1;
  undefined4 uStack_6c;
  undefined4 uStack_5c;
  undefined4 uStack_4c;
  undefined4 uStack_3c;
  int local_2c;
  int i;
  deconvolution_private_t *p;
  deconvolution_local_context_t *c;
  rt_function_t *f_local;
  
  puVar1 = (undefined8 *)f->local_context;
  if ((f->num_of_inputs == 2) || (f->num_of_inputs == 3)) {
    if (f->num_of_outputs == 1) {
      plVar2 = (long *)(*rt_malloc_func)(0xa0);
      if (plVar2 == (long *)0x0) {
        f_local._4_4_ = RT_FUNCTION_ERROR_MALLOC;
      }
      else {
        *puVar1 = plVar2;
        *plVar2 = (long)*f->inputs;
        p_Var3 = select_getter((rt_variable_t *)*plVar2);
        plVar2[1] = (long)p_Var3;
        plVar2[2] = (long)f->inputs[1];
        p_Var3 = select_getter((rt_variable_t *)plVar2[2]);
        plVar2[3] = (long)p_Var3;
        plVar2[6] = (long)*f->outputs;
        p_Var3 = select_getter((rt_variable_t *)plVar2[6]);
        plVar2[8] = (long)p_Var3;
        p_Var4 = select_setter((rt_variable_t *)plVar2[6]);
        plVar2[7] = (long)p_Var4;
        if (f->num_of_inputs < 3) {
          plVar2[4] = 0;
        }
        else {
          plVar2[4] = (long)f->inputs[2];
          p_Var3 = select_getter((rt_variable_t *)plVar2[4]);
          plVar2[5] = (long)p_Var3;
        }
        *(undefined4 *)((long)plVar2 + 0x9c) = 1;
        for (local_2c = 0; local_2c < *(int *)(puVar1 + 1); local_2c = local_2c + 1) {
          *(int *)((long)plVar2 + 0x9c) =
               *(int *)(*(long *)(*plVar2 + 8) + (long)local_2c * 4) * *(int *)((long)plVar2 + 0x9c)
          ;
        }
        *(int *)(plVar2 + 0x13) = (*(int *)*plVar2 - *(int *)(puVar1 + 1)) + -1;
        rVar5 = allocate_list((int)plVar2[0x13]);
        plVar2[9] = CONCAT44(uStack_3c,rVar5.size);
        plVar2[10] = (long)rVar5.data;
        rVar5 = allocate_list((int)plVar2[0x13]);
        plVar2[0xd] = CONCAT44(uStack_4c,rVar5.size);
        plVar2[0xe] = (long)rVar5.data;
        rVar5 = allocate_list((int)plVar2[0x13]);
        plVar2[0xb] = CONCAT44(uStack_5c,rVar5.size);
        plVar2[0xc] = (long)rVar5.data;
        rVar5 = allocate_list((int)plVar2[0x13]);
        plVar2[0xf] = CONCAT44(uStack_6c,rVar5.size);
        plVar2[0x10] = (long)rVar5.data;
        rVar5 = allocate_list((int)plVar2[0x13]);
        plVar2[0x11] = CONCAT44(i_1,rVar5.size);
        plVar2[0x12] = (long)rVar5.data;
        for (local_84 = 0; local_84 < (int)plVar2[0x13]; local_84 = local_84 + 1) {
          *(undefined4 *)(plVar2[0xe] + (long)local_84 * 4) =
               *(undefined4 *)(*(long *)(plVar2[2] + 8) + (long)(local_84 + 2) * 4);
          *(undefined4 *)(plVar2[10] + (long)local_84 * 4) =
               *(undefined4 *)
                (*(long *)(*plVar2 + 8) + (long)(local_84 + *(int *)(puVar1 + 1) + 1) * 4);
          *(undefined4 *)(plVar2[0xc] + (long)local_84 * 4) =
               *(undefined4 *)
                (*(long *)(plVar2[6] + 8) + (long)(local_84 + *(int *)(puVar1 + 1) + 1) * 4);
        }
        if (((((*(byte *)(*plVar2 + 0x10) & 0xf) == 0) && ((*(byte *)(plVar2[6] + 0x10) & 0xf) == 0)
             ) && ((*(byte *)(plVar2[2] + 0x10) & 0xf) == 0)) &&
           (((plVar2[4] != 0 && ((*(byte *)(plVar2[4] + 0x10) & 0xf) == 0)) || (plVar2[4] == 0)))) {
          f->exec_func = exec_deconvolution;
        }
        else {
          f->exec_func = exec_deconvolution_generic;
        }
        f_local._4_4_ = RT_FUNCTION_ERROR_NOERROR;
      }
    }
    else {
      f_local._4_4_ = RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS;
    }
  }
  else {
    f_local._4_4_ = RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  }
  return f_local._4_4_;
}

Assistant:

rt_function_error_t allocate_deconvolution_local_context(rt_function_t *f) {
  deconvolution_local_context_t *c =
      (deconvolution_local_context_t *)(f->local_context);

  if (f->num_of_inputs != 2 && f->num_of_inputs != 3) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  }

  if (f->num_of_outputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS;
  }

  deconvolution_private_t *p = rt_malloc_func(sizeof(deconvolution_private_t));
  if (p == 0) {
    return RT_FUNCTION_ERROR_MALLOC;
  }
  c->data = (void *)p;
  p->input = f->inputs[0];
  p->get_input = select_getter(p->input);

  p->weight = f->inputs[1];
  p->get_weight = select_getter(p->weight);

  p->output = f->outputs[0];
  p->get_output = select_getter(p->output);
  p->set_output = select_setter(p->output);

  if (f->num_of_inputs > 2) {
    p->bias = f->inputs[2];
    p->get_bias = select_getter(p->bias);
  } else {
    p->bias = 0;
  }

  p->base_loop_size = 1;
  for (int i = 0; i < c->base_axis; i++) {
    p->base_loop_size *= p->input->shape.data[i];
  }
  p->spatial_dims = p->input->shape.size - c->base_axis - 1;

  p->input_shape = allocate_list(p->spatial_dims);
  p->kernel_shape = allocate_list(p->spatial_dims);
  p->output_shape = allocate_list(p->spatial_dims);
  p->in_position = allocate_list(p->spatial_dims);
  p->out_position = allocate_list(p->spatial_dims);

  for (int i = 0; i < p->spatial_dims; i++) {
    p->kernel_shape.data[i] = p->weight->shape.data[i + 2];
    p->input_shape.data[i] = p->input->shape.data[i + c->base_axis + 1];
    p->output_shape.data[i] = p->output->shape.data[i + c->base_axis + 1];
  }

  if (p->input->type == NN_DATA_TYPE_FLOAT &&
      p->output->type == NN_DATA_TYPE_FLOAT &&
      p->weight->type == NN_DATA_TYPE_FLOAT &&
      ((p->bias && p->bias->type == NN_DATA_TYPE_FLOAT) || !p->bias)) {
#ifdef CONFIG_DECONVOLUTION_FLOAT32
    f->exec_func = exec_deconvolution;
#endif /* CONFIG_DECONVOLUTION_FLOAT32 */
  } else {
#ifdef CONFIG_DECONVOLUTION_GENERIC
    f->exec_func = exec_deconvolution_generic;
#endif /* CONFIG_DECONVOLUTION_GENERIC */
  }
  return RT_FUNCTION_ERROR_NOERROR;
}